

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O1

void __thiscall OSTEIDeriv1_Writer::WriteFormDeriv(OSTEIDeriv1_Writer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OSTEI_GeneratorInfo *pOVar2;
  pointer pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int local_360;
  int local_35c;
  uint local_358;
  int ncart4;
  string outvar;
  string full_idx_y;
  string full_idx_x;
  undefined1 local_2f0 [16];
  string local_2e0;
  uint local_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  uint local_2a4;
  int ncart4m;
  int ncart4p;
  string full_idx_z;
  QAM am;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220 [8];
  undefined8 uStack_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [8];
  undefined8 uStack_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [8];
  undefined8 uStack_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [8];
  undefined8 uStack_1b8;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [8];
  undefined8 uStack_198;
  undefined1 *local_190;
  undefined8 local_188;
  undefined1 local_180 [8];
  undefined8 uStack_178;
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160 [8];
  undefined8 uStack_158;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140 [8];
  undefined8 uStack_138;
  string invar_4m;
  string invar_3m;
  string invar_2m;
  string invar_1m;
  string invar_4p;
  string invar_3p;
  string invar_2p;
  string invar_1p;
  
  pOVar2 = (this->super_OSTEI_Writer_Base).info_;
  am.qam._M_elems[0] = (pOVar2->super_GeneratorInfoBase).finalam_.qam._M_elems[0];
  am.qam._M_elems[1] = (pOVar2->super_GeneratorInfoBase).finalam_.qam._M_elems[1];
  am.qam._M_elems[2] = (pOVar2->super_GeneratorInfoBase).finalam_.qam._M_elems[2];
  am.qam._M_elems[3] = (pOVar2->super_GeneratorInfoBase).finalam_.qam._M_elems[3];
  am.tag._M_dataplus._M_p = (pointer)&am.tag.field_2;
  pcVar3 = (pOVar2->super_GeneratorInfoBase).finalam_.tag._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&am.tag,pcVar3,
             pcVar3 + (pOVar2->super_GeneratorInfoBase).finalam_.tag._M_string_length);
  uVar4 = (uint)((am.qam._M_elems[0] + 1) * (am.qam._M_elems[0] + 2)) >> 1;
  if (am.qam._M_elems[0] < 0) {
    uVar4 = 0;
  }
  local_2bc = (uint)((am.qam._M_elems[1] + 2) * (am.qam._M_elems[1] + 1)) >> 1;
  local_358 = (uint)((am.qam._M_elems[2] + 2) * (am.qam._M_elems[2] + 1)) >> 1;
  ncart4 = (uint)((am.qam._M_elems[3] + 2) * (am.qam._M_elems[3] + 1)) >> 1;
  uVar10 = (uint)((am.qam._M_elems[1] + 3) * (am.qam._M_elems[1] + 2)) >> 1;
  if (am.qam._M_elems[1] < -1) {
    uVar10 = 0;
  }
  uVar9 = (uint)((am.qam._M_elems[2] + 3) * (am.qam._M_elems[2] + 2)) >> 1;
  if (am.qam._M_elems[2] < -1) {
    uVar9 = 0;
  }
  ncart4p = (uint)((am.qam._M_elems[3] + 3) * (am.qam._M_elems[3] + 2)) >> 1;
  if (am.qam._M_elems[3] < -1) {
    ncart4p = 0;
  }
  uVar12 = (uint)((am.qam._M_elems[1] + 1) * am.qam._M_elems[1]) >> 1;
  if (am.qam._M_elems[1] < 0) {
    local_2bc = 0;
  }
  if (am.qam._M_elems[1] < 1) {
    uVar12 = 0;
  }
  local_2a4 = (uint)((am.qam._M_elems[2] + 1) * am.qam._M_elems[2]) >> 1;
  if (am.qam._M_elems[2] < 0) {
    local_358 = 0;
  }
  if (am.qam._M_elems[2] < 1) {
    local_2a4 = 0;
  }
  ncart4m = (uint)((am.qam._M_elems[3] + 1) * am.qam._M_elems[3]) >> 1;
  if (am.qam._M_elems[3] < 0) {
    ncart4 = 0;
  }
  if (am.qam._M_elems[3] < 1) {
    ncart4m = 0;
  }
  full_idx_x.field_2._M_allocated_capacity._0_4_ = 0x525248;
  full_idx_x._M_string_length._0_4_ = 3;
  full_idx_x._M_string_length._4_4_ = 0;
  full_idx_x._M_dataplus._M_p = (pointer)&full_idx_x.field_2;
  ArrVarName(&outvar,&am,&full_idx_x);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_idx_x._M_dataplus._M_p != &full_idx_x.field_2) {
    operator_delete(full_idx_x._M_dataplus._M_p);
  }
  iVar7 = am.qam._M_elems[3];
  iVar6 = am.qam._M_elems[2];
  iVar5 = am.qam._M_elems[1];
  iVar11 = am.qam._M_elems[0];
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"2a","");
  full_idx_x._M_dataplus._M_p._0_4_ = iVar11 + 1;
  full_idx_x._M_dataplus._M_p._4_4_ = iVar5;
  full_idx_x._M_string_length._0_4_ = iVar6;
  full_idx_x._M_string_length._4_4_ = iVar7;
  if (local_150 == local_140) {
    local_2f0._8_8_ = uStack_138;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_2f0;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_150;
  }
  full_idx_x.field_2._8_8_ = local_148;
  local_148 = 0;
  local_140[0] = 0;
  full_idx_y.field_2._M_allocated_capacity._0_4_ = 0x525248;
  full_idx_y._M_string_length = 3;
  full_idx_y._M_dataplus._M_p = (pointer)&full_idx_y.field_2;
  local_150 = local_140;
  ArrVarName(&invar_1p,(QAM *)&full_idx_x,&full_idx_y);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_idx_y._M_dataplus._M_p != &full_idx_y.field_2) {
    operator_delete(full_idx_y._M_dataplus._M_p);
  }
  if ((undefined1 *)full_idx_x.field_2._M_allocated_capacity != local_2f0) {
    operator_delete((void *)full_idx_x.field_2._M_allocated_capacity);
  }
  if (local_150 != local_140) {
    operator_delete(local_150);
  }
  iVar7 = am.qam._M_elems[3];
  iVar6 = am.qam._M_elems[2];
  iVar5 = am.qam._M_elems[1];
  iVar11 = am.qam._M_elems[0];
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"2b","");
  full_idx_x._M_dataplus._M_p._4_4_ = iVar5 + 1;
  full_idx_x._M_dataplus._M_p._0_4_ = iVar11;
  full_idx_x._M_string_length._0_4_ = iVar6;
  full_idx_x._M_string_length._4_4_ = iVar7;
  if (local_170 == local_160) {
    local_2f0._8_8_ = uStack_158;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_2f0;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_170;
  }
  full_idx_x.field_2._8_8_ = local_168;
  local_168 = 0;
  local_160[0] = 0;
  full_idx_y.field_2._M_allocated_capacity._0_4_ = 0x525248;
  full_idx_y._M_string_length = 3;
  full_idx_y._M_dataplus._M_p = (pointer)&full_idx_y.field_2;
  local_170 = local_160;
  ArrVarName(&invar_2p,(QAM *)&full_idx_x,&full_idx_y);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_idx_y._M_dataplus._M_p != &full_idx_y.field_2) {
    operator_delete(full_idx_y._M_dataplus._M_p);
  }
  if ((undefined1 *)full_idx_x.field_2._M_allocated_capacity != local_2f0) {
    operator_delete((void *)full_idx_x.field_2._M_allocated_capacity);
  }
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  iVar7 = am.qam._M_elems[3];
  iVar6 = am.qam._M_elems[2];
  iVar5 = am.qam._M_elems[1];
  iVar11 = am.qam._M_elems[0];
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"2c","");
  full_idx_x._M_string_length._0_4_ = iVar6 + 1;
  full_idx_x._M_dataplus._M_p._0_4_ = iVar11;
  full_idx_x._M_dataplus._M_p._4_4_ = iVar5;
  full_idx_x._M_string_length._4_4_ = iVar7;
  if (local_190 == local_180) {
    local_2f0._8_8_ = uStack_178;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_2f0;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_190;
  }
  full_idx_x.field_2._8_8_ = local_188;
  local_188 = 0;
  local_180[0] = 0;
  full_idx_y.field_2._M_allocated_capacity._0_4_ = 0x525248;
  full_idx_y._M_string_length = 3;
  full_idx_y._M_dataplus._M_p = (pointer)&full_idx_y.field_2;
  local_190 = local_180;
  ArrVarName(&invar_3p,(QAM *)&full_idx_x,&full_idx_y);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_idx_y._M_dataplus._M_p != &full_idx_y.field_2) {
    operator_delete(full_idx_y._M_dataplus._M_p);
  }
  if ((undefined1 *)full_idx_x.field_2._M_allocated_capacity != local_2f0) {
    operator_delete((void *)full_idx_x.field_2._M_allocated_capacity);
  }
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  iVar7 = am.qam._M_elems[3];
  iVar6 = am.qam._M_elems[2];
  iVar5 = am.qam._M_elems[1];
  iVar11 = am.qam._M_elems[0];
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"2d","");
  full_idx_x._M_string_length._4_4_ = iVar7 + 1;
  full_idx_x._M_dataplus._M_p._0_4_ = iVar11;
  full_idx_x._M_dataplus._M_p._4_4_ = iVar5;
  full_idx_x._M_string_length._0_4_ = iVar6;
  if (local_1b0 == local_1a0) {
    local_2f0._8_8_ = uStack_198;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_2f0;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_1b0;
  }
  full_idx_x.field_2._8_8_ = local_1a8;
  local_1a8 = 0;
  local_1a0[0] = 0;
  full_idx_y.field_2._M_allocated_capacity._0_4_ = 0x525248;
  full_idx_y._M_string_length = 3;
  full_idx_y._M_dataplus._M_p = (pointer)&full_idx_y.field_2;
  local_1b0 = local_1a0;
  ArrVarName(&invar_4p,(QAM *)&full_idx_x,&full_idx_y);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_idx_y._M_dataplus._M_p != &full_idx_y.field_2) {
    operator_delete(full_idx_y._M_dataplus._M_p);
  }
  if ((undefined1 *)full_idx_x.field_2._M_allocated_capacity != local_2f0) {
    operator_delete((void *)full_idx_x.field_2._M_allocated_capacity);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  iVar5 = am.qam._M_elems[3];
  iVar11 = am.qam._M_elems[0];
  local_2b8._0_4_ = am.qam._M_elems[1];
  local_2b8._4_4_ = am.qam._M_elems[2];
  uStack_2b0 = 0;
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  full_idx_x._M_dataplus._M_p._0_4_ = iVar11 + -1;
  full_idx_x._M_dataplus._M_p._4_4_ = (int)local_2b8;
  full_idx_x._M_string_length._0_4_ = local_2b8._4_4_;
  full_idx_x._M_string_length._4_4_ = iVar5;
  if (local_1d0 == local_1c0) {
    local_2f0._8_8_ = uStack_1b8;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_2f0;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_1d0;
  }
  full_idx_x.field_2._8_8_ = local_1c8;
  local_1c8 = 0;
  local_1c0[0] = 0;
  full_idx_y.field_2._M_allocated_capacity._0_4_ = 0x525248;
  full_idx_y._M_string_length = 3;
  full_idx_y._M_dataplus._M_p = (pointer)&full_idx_y.field_2;
  local_1d0 = local_1c0;
  ArrVarName(&invar_1m,(QAM *)&full_idx_x,&full_idx_y);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_idx_y._M_dataplus._M_p != &full_idx_y.field_2) {
    operator_delete(full_idx_y._M_dataplus._M_p);
  }
  if ((undefined1 *)full_idx_x.field_2._M_allocated_capacity != local_2f0) {
    operator_delete((void *)full_idx_x.field_2._M_allocated_capacity);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  iVar5 = am.qam._M_elems[1];
  iVar11 = am.qam._M_elems[0];
  local_2b8._0_4_ = am.qam._M_elems[2];
  local_2b8._4_4_ = am.qam._M_elems[3];
  uStack_2b0 = 0;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
  full_idx_x._M_dataplus._M_p._4_4_ = iVar5 + -1;
  full_idx_x._M_dataplus._M_p._0_4_ = iVar11;
  full_idx_x._M_string_length._0_4_ = (int)local_2b8;
  full_idx_x._M_string_length._4_4_ = local_2b8._4_4_;
  if (local_1f0 == local_1e0) {
    local_2f0._8_8_ = uStack_1d8;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_2f0;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_1f0;
  }
  full_idx_x.field_2._8_8_ = local_1e8;
  local_1e8 = 0;
  local_1e0[0] = 0;
  full_idx_y.field_2._M_allocated_capacity._0_4_ = 0x525248;
  full_idx_y._M_string_length = 3;
  full_idx_y._M_dataplus._M_p = (pointer)&full_idx_y.field_2;
  local_1f0 = local_1e0;
  ArrVarName(&invar_2m,(QAM *)&full_idx_x,&full_idx_y);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_idx_y._M_dataplus._M_p != &full_idx_y.field_2) {
    operator_delete(full_idx_y._M_dataplus._M_p);
  }
  if ((undefined1 *)full_idx_x.field_2._M_allocated_capacity != local_2f0) {
    operator_delete((void *)full_idx_x.field_2._M_allocated_capacity);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  iVar5 = am.qam._M_elems[3];
  iVar11 = am.qam._M_elems[2];
  local_2b8._0_4_ = am.qam._M_elems[0];
  local_2b8._4_4_ = am.qam._M_elems[1];
  uStack_2b0 = 0;
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
  full_idx_x._M_string_length._0_4_ = iVar11 + -1;
  full_idx_x._M_dataplus._M_p._0_4_ = (int)local_2b8;
  full_idx_x._M_dataplus._M_p._4_4_ = local_2b8._4_4_;
  full_idx_x._M_string_length._4_4_ = iVar5;
  if (local_210 == local_200) {
    local_2f0._8_8_ = uStack_1f8;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_2f0;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_210;
  }
  full_idx_x.field_2._8_8_ = local_208;
  local_208 = 0;
  local_200[0] = 0;
  full_idx_y.field_2._M_allocated_capacity._0_4_ = 0x525248;
  full_idx_y._M_string_length = 3;
  full_idx_y._M_dataplus._M_p = (pointer)&full_idx_y.field_2;
  local_210 = local_200;
  ArrVarName(&invar_3m,(QAM *)&full_idx_x,&full_idx_y);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_idx_y._M_dataplus._M_p != &full_idx_y.field_2) {
    operator_delete(full_idx_y._M_dataplus._M_p);
  }
  if ((undefined1 *)full_idx_x.field_2._M_allocated_capacity != local_2f0) {
    operator_delete((void *)full_idx_x.field_2._M_allocated_capacity);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  iVar5 = am.qam._M_elems[3];
  iVar11 = am.qam._M_elems[2];
  local_2b8._0_4_ = am.qam._M_elems[0];
  local_2b8._4_4_ = am.qam._M_elems[1];
  uStack_2b0 = 0;
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
  full_idx_x._M_string_length._4_4_ = iVar5 + -1;
  full_idx_x._M_dataplus._M_p._0_4_ = (int)local_2b8;
  full_idx_x._M_dataplus._M_p._4_4_ = local_2b8._4_4_;
  full_idx_x._M_string_length._0_4_ = iVar11;
  if (local_230 == local_220) {
    local_2f0._8_8_ = uStack_218;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_2f0;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_230;
  }
  full_idx_x.field_2._8_8_ = local_228;
  local_228 = 0;
  local_220[0] = 0;
  full_idx_y.field_2._M_allocated_capacity._0_4_ = 0x525248;
  full_idx_y._M_string_length = 3;
  full_idx_y._M_dataplus._M_p = (pointer)&full_idx_y.field_2;
  local_230 = local_220;
  ArrVarName(&invar_4m,(QAM *)&full_idx_x,&full_idx_y);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_idx_y._M_dataplus._M_p != &full_idx_y.field_2) {
    operator_delete(full_idx_y._M_dataplus._M_p);
  }
  if ((undefined1 *)full_idx_x.field_2._M_allocated_capacity != local_2f0) {
    operator_delete((void *)full_idx_x.field_2._M_allocated_capacity);
  }
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent4_abi_cxx11_._M_dataplus._M_p,
                      indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"struct RecurInfo const * const aminfo_1 = &recurinfo_array[am_recur_map[",0x48)
  ;
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,am.qam._M_elems[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]];\n",4);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent4_abi_cxx11_._M_dataplus._M_p,
                      indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"struct RecurInfo const * const aminfo_2 = &recurinfo_array[am_recur_map[",0x48)
  ;
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,am.qam._M_elems[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]];\n",4);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent4_abi_cxx11_._M_dataplus._M_p,
                      indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"struct RecurInfo const * const aminfo_3 = &recurinfo_array[am_recur_map[",0x48)
  ;
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,am.qam._M_elems[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]];\n",4);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent4_abi_cxx11_._M_dataplus._M_p,
                      indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"struct RecurInfo const * const aminfo_4 = &recurinfo_array[am_recur_map[",0x48)
  ;
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,am.qam._M_elems[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]];\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n",1);
  full_idx_x._M_string_length._0_4_ = 0;
  full_idx_x._M_string_length._4_4_ = 0;
  full_idx_x.field_2._M_allocated_capacity =
       full_idx_x.field_2._M_allocated_capacity & 0xffffffffffffff00;
  full_idx_y._M_dataplus._M_p = (pointer)&full_idx_y.field_2;
  full_idx_y._M_string_length = 0;
  full_idx_y.field_2._M_allocated_capacity._0_4_ =
       full_idx_y.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  full_idx_z._M_dataplus._M_p = (pointer)&full_idx_z.field_2;
  full_idx_z._M_string_length = 0;
  full_idx_z.field_2._M_local_buf[0] = '\0';
  full_idx_x._M_dataplus._M_p = (pointer)&full_idx_x.field_2;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent4_abi_cxx11_._M_dataplus._M_p,
                      indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"int idx_x, idx_y, idx_z;\n",0x19);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent4_abi_cxx11_._M_dataplus._M_p,
                      indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"int startidx = 0;\n",0x12);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent4_abi_cxx11_._M_dataplus._M_p,
                      indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"for(int n1 = 0; n1 < ",0x15);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,uVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"; n1++)\n",8);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent4_abi_cxx11_._M_dataplus._M_p,
                      indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"for(int n2 = 0; n2 < ",0x15);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,local_2bc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"; n2++)\n",8);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent4_abi_cxx11_._M_dataplus._M_p,
                      indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"for(int n3 = 0; n3 < ",0x15);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,local_358);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"; n3++)\n",8);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent4_abi_cxx11_._M_dataplus._M_p,
                      indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"for(int n4 = 0; n4 < ",0x15);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,ncart4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"; n4++)\n",8);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent4_abi_cxx11_._M_dataplus._M_p,
                      indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
  iVar11 = ((this->super_OSTEI_Writer_Base).info_)->deriv1_missing_center_;
  local_2b8 = CONCAT44(local_2b8._4_4_,iVar11);
  if (iVar11 == 0) {
LAB_00133dbb:
    std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n\n",2)
    ;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"// Second Center\n",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"struct RecurInfo const * aminfo_n2 = aminfo_2 + n2;\n",0x34);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"idx_x = aminfo_n2->idx[0][2];\n",0x1e);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"idx_y = aminfo_n2->idx[1][2];\n",0x1e);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"idx_z = aminfo_n2->idx[2][2];\n",0x1e);
    iVar11 = uVar10 * local_358;
    local_35c = ncart4 * iVar11;
    local_360 = ncart4 * local_358;
    StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [8])"+idx_x*",&local_360,
               (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2e0);
    paVar1 = &local_2e0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    local_35c = ncart4 * iVar11;
    local_360 = ncart4 * local_358;
    StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [8])"+idx_y*",&local_360,
               (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    local_35c = iVar11 * ncart4;
    local_360 = ncart4 * local_358;
    StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [8])"+idx_z*",&local_360,
               (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 3] = ",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,invar_2p._M_dataplus._M_p,invar_2p._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,full_idx_x._M_dataplus._M_p,
                        CONCAT44(full_idx_x._M_string_length._4_4_,(int)full_idx_x._M_string_length)
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 4] = ",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,invar_2p._M_dataplus._M_p,invar_2p._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,full_idx_y._M_dataplus._M_p,full_idx_y._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 5] = ",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,invar_2p._M_dataplus._M_p,invar_2p._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,full_idx_z._M_dataplus._M_p,full_idx_z._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    if (0 < am.qam._M_elems[1]) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"idx_x = aminfo_n2->idx[0][0];\n",0x1e);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"idx_y = aminfo_n2->idx[1][0];\n",0x1e);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"idx_z = aminfo_n2->idx[2][0];\n",0x1e);
      iVar11 = uVar12 * local_358;
      local_35c = ncart4 * iVar11;
      local_360 = ncart4 * local_358;
      StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [8])"+idx_x*",&local_360,
                 (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      local_35c = ncart4 * iVar11;
      local_360 = ncart4 * local_358;
      StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [8])"+idx_y*",&local_360,
                 (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      local_35c = iVar11 * ncart4;
      local_360 = ncart4 * local_358;
      StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [8])"+idx_z*",&local_360,
                 (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if(idx_x >= 0) ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"[startidx + 3] -= aminfo_n2->ijk[0] * ",0x26);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,invar_2m._M_dataplus._M_p,invar_2m._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,full_idx_x._M_dataplus._M_p,
                          CONCAT44(full_idx_x._M_string_length._4_4_,
                                   (int)full_idx_x._M_string_length));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if(idx_y >= 0) ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"[startidx + 4] -= aminfo_n2->ijk[1] * ",0x26);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,invar_2m._M_dataplus._M_p,invar_2m._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,full_idx_y._M_dataplus._M_p,full_idx_y._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if(idx_z >= 0) ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"[startidx + 5] -= aminfo_n2->ijk[2] * ",0x26);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,invar_2m._M_dataplus._M_p,invar_2m._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,full_idx_z._M_dataplus._M_p,full_idx_z._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    }
    if ((int)local_2b8 != 2) goto LAB_001345b4;
LAB_00134dd6:
    std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n\n",2)
    ;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"// Fourth Center\n",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"struct RecurInfo const * aminfo_n4 = aminfo_4 + n4;\n",0x34);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"idx_x = aminfo_n4->idx[0][2];\n",0x1e);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"idx_y = aminfo_n4->idx[1][2];\n",0x1e);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"idx_z = aminfo_n4->idx[2][2];\n",0x1e);
    iVar11 = local_2bc * local_358;
    local_35c = ncart4p * iVar11;
    local_360 = ncart4p * local_358;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
              (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [5])"+n2*",&local_360,
               (char (*) [5])"+n3*",&ncart4p,(char (*) [7])"+idx_x");
    std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2e0);
    paVar1 = &local_2e0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    local_35c = ncart4p * iVar11;
    local_360 = ncart4p * local_358;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
              (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [5])"+n2*",&local_360,
               (char (*) [5])"+n3*",&ncart4p,(char (*) [7])"+idx_y");
    std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    local_35c = ncart4p * iVar11;
    local_360 = ncart4p * local_358;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
              (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [5])"+n2*",&local_360,
               (char (*) [5])"+n3*",&ncart4p,(char (*) [7])"+idx_z");
    std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx +  9] = ",0x12);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,invar_4p._M_dataplus._M_p,invar_4p._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,full_idx_x._M_dataplus._M_p,
                        CONCAT44(full_idx_x._M_string_length._4_4_,(int)full_idx_x._M_string_length)
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 10] = ",0x12);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,invar_4p._M_dataplus._M_p,invar_4p._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,full_idx_y._M_dataplus._M_p,full_idx_y._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 11] = ",0x12);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,invar_4p._M_dataplus._M_p,invar_4p._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,full_idx_z._M_dataplus._M_p,full_idx_z._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    if (0 < am.qam._M_elems[3]) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"idx_x = aminfo_n4->idx[0][0];\n",0x1e);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"idx_y = aminfo_n4->idx[1][0];\n",0x1e);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"idx_z = aminfo_n4->idx[2][0];\n",0x1e);
      local_35c = ncart4m * iVar11;
      local_360 = ncart4m * local_358;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
                (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [5])"+n2*",&local_360,
                 (char (*) [5])"+n3*",&ncart4m,(char (*) [7])"+idx_x");
      std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      local_35c = ncart4m * iVar11;
      local_360 = ncart4m * local_358;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
                (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [5])"+n2*",&local_360,
                 (char (*) [5])"+n3*",&ncart4m,(char (*) [7])"+idx_y");
      std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      local_35c = iVar11 * ncart4m;
      local_360 = local_358 * ncart4m;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
                (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [5])"+n2*",&local_360,
                 (char (*) [5])"+n3*",&ncart4m,(char (*) [7])"+idx_z");
      std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if(idx_x >= 0) ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"[startidx +  9] -= aminfo_n4->ijk[0] * ",0x27);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,invar_4m._M_dataplus._M_p,invar_4m._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,full_idx_x._M_dataplus._M_p,
                          CONCAT44(full_idx_x._M_string_length._4_4_,
                                   (int)full_idx_x._M_string_length));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if(idx_y >= 0) ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"[startidx + 10] -= aminfo_n4->ijk[1] * ",0x27);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,invar_4m._M_dataplus._M_p,invar_4m._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,full_idx_y._M_dataplus._M_p,full_idx_y._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if(idx_z >= 0) ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"[startidx + 11] -= aminfo_n4->ijk[2] * ",0x27);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,invar_4m._M_dataplus._M_p,invar_4m._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,full_idx_z._M_dataplus._M_p,full_idx_z._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    }
    switch(local_2b8 & 0xffffffff) {
    case 0:
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_OSTEI_Writer_Base).os_,"\n\n",2);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"// First Center\n",0x10);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 0] = -(",0x13);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 3] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 6] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx +  9]);\n",0x12);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 1] = -(",0x13);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 4] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 7] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 10]);\n",0x12);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 2] = -(",0x13);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 5] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 8] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 11]);\n",0x12);
      if ((int)local_2b8 != 3) {
        if ((int)local_2b8 != 2) {
          if ((int)local_2b8 != 1) goto switchD_00135610_default;
          goto switchD_00135610_caseD_1;
        }
        goto switchD_00135610_caseD_2;
      }
      break;
    case 1:
switchD_00135610_caseD_1:
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_OSTEI_Writer_Base).os_,"\n\n",2);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"// Second Center\n",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 3] = -(",0x13);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 0] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 6] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx +  9]);\n",0x12);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 4] = -(",0x13);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 1] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 7] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 10]);\n",0x12);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 5] = -(",0x13);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 2] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 8] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 11]);\n",0x12);
      if ((int)local_2b8 != 3) {
        if ((int)local_2b8 != 2) goto switchD_00135610_default;
        goto switchD_00135610_caseD_2;
      }
      break;
    case 2:
switchD_00135610_caseD_2:
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_OSTEI_Writer_Base).os_,"\n\n",2);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"// Third Center\n",0x10);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 6] = -(",0x13);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 0] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 3] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx +  9]);\n",0x12);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 7] = -(",0x13);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 1] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 4] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 10]);\n",0x12);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 8] = -(",0x13);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 2] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 5] + ",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 11]);\n",0x12);
      if ((int)local_2b8 != 3) goto switchD_00135610_default;
      break;
    case 3:
      break;
    default:
      goto switchD_00135610_default;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n\n",2)
    ;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"// First Center\n",0x10);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"struct RecurInfo const * aminfo_n1 = aminfo_1 + n1;\n",0x34);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"idx_x = aminfo_n1->idx[0][2];\n",0x1e);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"idx_y = aminfo_n1->idx[1][2];\n",0x1e);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"idx_z = aminfo_n1->idx[2][2];\n",0x1e);
    iVar11 = local_358 * local_2bc;
    local_35c = ncart4 * iVar11;
    local_360 = ncart4 * local_358;
    StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (&local_2e0,(char (*) [7])0x14babd,&local_35c,(char (*) [5])"+n2*",&local_360,
               (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    local_35c = ncart4 * iVar11;
    local_360 = ncart4 * local_358;
    StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (&local_2e0,(char (*) [7])0x14bac5,&local_35c,(char (*) [5])"+n2*",&local_360,
               (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    local_35c = ncart4 * iVar11;
    local_360 = ncart4 * local_358;
    StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (&local_2e0,(char (*) [7])0x14bacd,&local_35c,(char (*) [5])"+n2*",&local_360,
               (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 0] = ",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,invar_1p._M_dataplus._M_p,invar_1p._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,full_idx_x._M_dataplus._M_p,
                        CONCAT44(full_idx_x._M_string_length._4_4_,(int)full_idx_x._M_string_length)
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 1] = ",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,invar_1p._M_dataplus._M_p,invar_1p._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,full_idx_y._M_dataplus._M_p,full_idx_y._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 2] = ",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,invar_1p._M_dataplus._M_p,invar_1p._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,full_idx_z._M_dataplus._M_p,full_idx_z._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    if (0 < am.qam._M_elems[0]) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"idx_x = aminfo_n1->idx[0][0];\n",0x1e);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"idx_y = aminfo_n1->idx[1][0];\n",0x1e);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"idx_z = aminfo_n1->idx[2][0];\n",0x1e);
      local_35c = ncart4 * iVar11;
      local_360 = ncart4 * local_358;
      StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (&local_2e0,(char (*) [7])0x14babd,&local_35c,(char (*) [5])"+n2*",&local_360,
                 (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      local_35c = ncart4 * iVar11;
      local_360 = ncart4 * local_358;
      StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (&local_2e0,(char (*) [7])0x14bac5,&local_35c,(char (*) [5])"+n2*",&local_360,
                 (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      local_35c = iVar11 * ncart4;
      local_360 = ncart4 * local_358;
      StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (&local_2e0,(char (*) [7])0x14bacd,&local_35c,(char (*) [5])"+n2*",&local_360,
                 (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if(idx_x >= 0) ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"[startidx + 0] -= aminfo_n1->ijk[0] * ",0x26);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,invar_1m._M_dataplus._M_p,invar_1m._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,full_idx_x._M_dataplus._M_p,
                          CONCAT44(full_idx_x._M_string_length._4_4_,
                                   (int)full_idx_x._M_string_length));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if(idx_y >= 0) ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"[startidx + 1] -= aminfo_n1->ijk[1] * ",0x26);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,invar_1m._M_dataplus._M_p,invar_1m._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,full_idx_y._M_dataplus._M_p,full_idx_y._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if(idx_z >= 0) ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"[startidx + 2] -= aminfo_n1->ijk[2] * ",0x26);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,invar_1m._M_dataplus._M_p,invar_1m._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,full_idx_z._M_dataplus._M_p,full_idx_z._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    }
    if ((int)local_2b8 != 1) goto LAB_00133dbb;
LAB_001345b4:
    std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n\n",2)
    ;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"// Third Center\n",0x10);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"struct RecurInfo const * aminfo_n3 = aminfo_3 + n3;\n",0x34);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"idx_x = aminfo_n3->idx[0][2];\n",0x1e);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"idx_y = aminfo_n3->idx[1][2];\n",0x1e);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"idx_z = aminfo_n3->idx[2][2];\n",0x1e);
    iVar11 = uVar9 * local_2bc;
    local_35c = ncart4 * iVar11;
    local_360 = ncart4 * uVar9;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
              (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [5])"+n2*",&local_360,
               (char (*) [8])"+idx_x*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2e0);
    paVar1 = &local_2e0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    local_35c = ncart4 * iVar11;
    local_360 = ncart4 * uVar9;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
              (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [5])"+n2*",&local_360,
               (char (*) [8])"+idx_y*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    local_35c = iVar11 * ncart4;
    local_360 = uVar9 * ncart4;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
              (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [5])"+n2*",&local_360,
               (char (*) [8])"+idx_z*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 6] = ",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,invar_3p._M_dataplus._M_p,invar_3p._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,full_idx_x._M_dataplus._M_p,
                        CONCAT44(full_idx_x._M_string_length._4_4_,(int)full_idx_x._M_string_length)
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 7] = ",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,invar_3p._M_dataplus._M_p,invar_3p._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,full_idx_y._M_dataplus._M_p,full_idx_y._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                        indent5_abi_cxx11_._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 8] = ",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,invar_3p._M_dataplus._M_p,invar_3p._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,full_idx_z._M_dataplus._M_p,full_idx_z._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    if (0 < am.qam._M_elems[2]) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"idx_x = aminfo_n3->idx[0][0];\n",0x1e);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"idx_y = aminfo_n3->idx[1][0];\n",0x1e);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"idx_z = aminfo_n3->idx[2][0];\n",0x1e);
      iVar11 = local_2a4 * local_2bc;
      local_35c = ncart4 * iVar11;
      local_360 = ncart4 * local_2a4;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
                (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [5])"+n2*",&local_360,
                 (char (*) [8])"+idx_x*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      local_35c = ncart4 * iVar11;
      local_360 = ncart4 * local_2a4;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
                (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [5])"+n2*",&local_360,
                 (char (*) [8])"+idx_y*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      local_35c = iVar11 * ncart4;
      local_360 = local_2a4 * ncart4;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
                (&local_2e0,(char (*) [4])"n1*",&local_35c,(char (*) [5])"+n2*",&local_360,
                 (char (*) [8])"+idx_z*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if(idx_x >= 0) ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"[startidx + 6] -= aminfo_n3->ijk[0] * ",0x26);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,invar_3m._M_dataplus._M_p,invar_3m._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,full_idx_x._M_dataplus._M_p,
                          CONCAT44(full_idx_x._M_string_length._4_4_,
                                   (int)full_idx_x._M_string_length));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if(idx_y >= 0) ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"[startidx + 7] -= aminfo_n3->ijk[1] * ",0x26);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,invar_3m._M_dataplus._M_p,invar_3m._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,full_idx_y._M_dataplus._M_p,full_idx_y._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                          indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"if(idx_z >= 0) ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"[startidx + 8] -= aminfo_n3->ijk[2] * ",0x26);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,invar_3m._M_dataplus._M_p,invar_3m._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,full_idx_z._M_dataplus._M_p,full_idx_z._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
    }
    if ((int)local_2b8 != 3) goto LAB_00134dd6;
  }
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n\n",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"// Fourth Center\n",0x11);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx +  9] = -(",0x14);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 0] + ",0x11);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 3] + ",0x11);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 6]);\n",0x11);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 10] = -(",0x14);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 1] + ",0x11);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 4] + ",0x11);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 7]);\n",0x11);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 11] = -(",0x14);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 2] + ",0x11);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 5] + ",0x11);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,outvar._M_dataplus._M_p,outvar._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[startidx + 8]);\n",0x11);
switchD_00135610_default:
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n\n",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"startidx += 12;\n",0x10);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent4_abi_cxx11_._M_dataplus._M_p,
                      indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"} // close loop for forming derivatives\n\n",0x29);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_idx_z._M_dataplus._M_p != &full_idx_z.field_2) {
    operator_delete(full_idx_z._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_idx_y._M_dataplus._M_p != &full_idx_y.field_2) {
    operator_delete(full_idx_y._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)full_idx_x._M_dataplus._M_p != &full_idx_x.field_2) {
    operator_delete(full_idx_x._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invar_4m._M_dataplus._M_p != &invar_4m.field_2) {
    operator_delete(invar_4m._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invar_3m._M_dataplus._M_p != &invar_3m.field_2) {
    operator_delete(invar_3m._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invar_2m._M_dataplus._M_p != &invar_2m.field_2) {
    operator_delete(invar_2m._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invar_1m._M_dataplus._M_p != &invar_1m.field_2) {
    operator_delete(invar_1m._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invar_4p._M_dataplus._M_p != &invar_4p.field_2) {
    operator_delete(invar_4p._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invar_3p._M_dataplus._M_p != &invar_3p.field_2) {
    operator_delete(invar_3p._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invar_2p._M_dataplus._M_p != &invar_2p.field_2) {
    operator_delete(invar_2p._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invar_1p._M_dataplus._M_p != &invar_1p.field_2) {
    operator_delete(invar_1p._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outvar._M_dataplus._M_p != &outvar.field_2) {
    operator_delete(outvar._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)am.tag._M_dataplus._M_p != &am.tag.field_2) {
    operator_delete(am.tag._M_dataplus._M_p);
  }
  return;
}

Assistant:

void OSTEIDeriv1_Writer::WriteFormDeriv(void) const
{
    QAM am = info_.FinalAM();
    const int ncart1 = NCART(am[0]);
    const int ncart2 = NCART(am[1]);
    const int ncart3 = NCART(am[2]);
    const int ncart4 = NCART(am[3]);

    const int ncart2p = NCART(am[1]+1);
    const int ncart3p = NCART(am[2]+1);
    const int ncart4p = NCART(am[3]+1);
    const int ncart2m = NCART(am[1]-1);
    const int ncart3m = NCART(am[2]-1);
    const int ncart4m = NCART(am[3]-1);

    std::string outvar = HRRVarName(am);
    std::string invar_1p = HRRVarName(QAM({am[0]+1, am[1]  , am[2]  , am[3]  }, "2a"));
    std::string invar_2p = HRRVarName(QAM({am[0],   am[1]+1, am[2]  , am[3]  }, "2b"));
    std::string invar_3p = HRRVarName(QAM({am[0],   am[1]  , am[2]+1, am[3]  }, "2c"));
    std::string invar_4p = HRRVarName(QAM({am[0],   am[1]  , am[2]  , am[3]+1}, "2d"));
    std::string invar_1m = HRRVarName({am[0]-1, am[1]  , am[2]  , am[3]  });
    std::string invar_2m = HRRVarName({am[0],   am[1]-1, am[2]  , am[3]  });
    std::string invar_3m = HRRVarName({am[0],   am[1]  , am[2]-1, am[3]  });
    std::string invar_4m = HRRVarName({am[0],   am[1]  , am[2]  , am[3]-1});

    os_ << indent4 << "struct RecurInfo const * const aminfo_1 = &recurinfo_array[am_recur_map[" << am[0] << "]];\n";
    os_ << indent4 << "struct RecurInfo const * const aminfo_2 = &recurinfo_array[am_recur_map[" << am[1] << "]];\n";
    os_ << indent4 << "struct RecurInfo const * const aminfo_3 = &recurinfo_array[am_recur_map[" << am[2] << "]];\n";
    os_ << indent4 << "struct RecurInfo const * const aminfo_4 = &recurinfo_array[am_recur_map[" << am[3] << "]];\n";
    os_ << "\n";

    std::string full_idx_x, full_idx_y, full_idx_z;
    //os_ << indent4 << "double * restrict " << outvar << " = " << ArrVarName(am)
    //               << " + real_abcd * " << ncart1*ncart2*ncart3*ncart4 << " * 12;\n\n";
    os_ << indent4 << "int idx_x, idx_y, idx_z;\n";
    os_ << indent4 << "int startidx = 0;\n";
    os_ << indent4 << "for(int n1 = 0; n1 < " << ncart1 << "; n1++)\n";
    os_ << indent4 << "for(int n2 = 0; n2 < " << ncart2 << "; n2++)\n";
    os_ << indent4 << "for(int n3 = 0; n3 < " << ncart3 << "; n3++)\n";
    os_ << indent4 << "for(int n4 = 0; n4 < " << ncart4 << "; n4++)\n";
    os_ << indent4 << "{\n";

    int missing_center = info_.Deriv1_MissingCenter();

    if(missing_center != 0)
    {
        os_ << "\n\n";
        os_ << indent5 << "// First Center\n";
        os_ << indent5 << "struct RecurInfo const * aminfo_n1 = aminfo_1 + n1;\n";
        os_ << indent5 << "idx_x = aminfo_n1->idx[0][2];\n";
        os_ << indent5 << "idx_y = aminfo_n1->idx[1][2];\n";
        os_ << indent5 << "idx_z = aminfo_n1->idx[2][2];\n";
        full_idx_x = StringBuilder("idx_x*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        full_idx_y = StringBuilder("idx_y*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        full_idx_z = StringBuilder("idx_z*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        os_ << indent5 << outvar << "[startidx + 0] = " << invar_1p << "[" << full_idx_x << "];\n";
        os_ << indent5 << outvar << "[startidx + 1] = " << invar_1p << "[" << full_idx_y << "];\n";
        os_ << indent5 << outvar << "[startidx + 2] = " << invar_1p << "[" << full_idx_z << "];\n";

        if(am[0] > 0)
        {
            os_ << indent5 << "idx_x = aminfo_n1->idx[0][0];\n";
            os_ << indent5 << "idx_y = aminfo_n1->idx[1][0];\n";
            os_ << indent5 << "idx_z = aminfo_n1->idx[2][0];\n";
            full_idx_x = StringBuilder("idx_x*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            full_idx_y = StringBuilder("idx_y*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            full_idx_z = StringBuilder("idx_z*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            os_ << indent5 << "if(idx_x >= 0) " << outvar << "[startidx + 0] -= aminfo_n1->ijk[0] * " << invar_1m << "[" << full_idx_x << "];\n";
            os_ << indent5 << "if(idx_y >= 0) " << outvar << "[startidx + 1] -= aminfo_n1->ijk[1] * " << invar_1m << "[" << full_idx_y << "];\n";
            os_ << indent5 << "if(idx_z >= 0) " << outvar << "[startidx + 2] -= aminfo_n1->ijk[2] * " << invar_1m << "[" << full_idx_z << "];\n";
        }
    }


    if(missing_center != 1)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Second Center\n";
        os_ << indent5 << "struct RecurInfo const * aminfo_n2 = aminfo_2 + n2;\n";
        os_ << indent5 << "idx_x = aminfo_n2->idx[0][2];\n";
        os_ << indent5 << "idx_y = aminfo_n2->idx[1][2];\n";
        os_ << indent5 << "idx_z = aminfo_n2->idx[2][2];\n";
        full_idx_x = StringBuilder("n1*", ncart2p*ncart3*ncart4, "+idx_x*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        full_idx_y = StringBuilder("n1*", ncart2p*ncart3*ncart4, "+idx_y*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        full_idx_z = StringBuilder("n1*", ncart2p*ncart3*ncart4, "+idx_z*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        os_ << indent5 << outvar << "[startidx + 3] = " << invar_2p << "[" << full_idx_x << "];\n";
        os_ << indent5 << outvar << "[startidx + 4] = " << invar_2p << "[" << full_idx_y << "];\n";
        os_ << indent5 << outvar << "[startidx + 5] = " << invar_2p << "[" << full_idx_z << "];\n";

        if(am[1] > 0)
        {
            os_ << indent5 << "idx_x = aminfo_n2->idx[0][0];\n";
            os_ << indent5 << "idx_y = aminfo_n2->idx[1][0];\n";
            os_ << indent5 << "idx_z = aminfo_n2->idx[2][0];\n";
            full_idx_x = StringBuilder("n1*", ncart2m*ncart3*ncart4, "+idx_x*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            full_idx_y = StringBuilder("n1*", ncart2m*ncart3*ncart4, "+idx_y*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            full_idx_z = StringBuilder("n1*", ncart2m*ncart3*ncart4, "+idx_z*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            os_ << indent5 << "if(idx_x >= 0) " << outvar << "[startidx + 3] -= aminfo_n2->ijk[0] * " << invar_2m << "[" << full_idx_x << "];\n";
            os_ << indent5 << "if(idx_y >= 0) " << outvar << "[startidx + 4] -= aminfo_n2->ijk[1] * " << invar_2m << "[" << full_idx_y << "];\n";
            os_ << indent5 << "if(idx_z >= 0) " << outvar << "[startidx + 5] -= aminfo_n2->ijk[2] * " << invar_2m << "[" << full_idx_z << "];\n";
        }
    }


    if(missing_center != 2)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Third Center\n";
        os_ << indent5 << "struct RecurInfo const * aminfo_n3 = aminfo_3 + n3;\n";
        os_ << indent5 << "idx_x = aminfo_n3->idx[0][2];\n";
        os_ << indent5 << "idx_y = aminfo_n3->idx[1][2];\n";
        os_ << indent5 << "idx_z = aminfo_n3->idx[2][2];\n";
        full_idx_x = StringBuilder("n1*", ncart2*ncart3p*ncart4, "+n2*", ncart3p*ncart4, "+idx_x*", ncart4, "+n4");
        full_idx_y = StringBuilder("n1*", ncart2*ncart3p*ncart4, "+n2*", ncart3p*ncart4, "+idx_y*", ncart4, "+n4");
        full_idx_z = StringBuilder("n1*", ncart2*ncart3p*ncart4, "+n2*", ncart3p*ncart4, "+idx_z*", ncart4, "+n4");
        os_ << indent5 << outvar << "[startidx + 6] = " << invar_3p << "[" << full_idx_x << "];\n";
        os_ << indent5 << outvar << "[startidx + 7] = " << invar_3p << "[" << full_idx_y << "];\n";
        os_ << indent5 << outvar << "[startidx + 8] = " << invar_3p << "[" << full_idx_z << "];\n";

        if(am[2] > 0)
        {
            os_ << indent5 << "idx_x = aminfo_n3->idx[0][0];\n";
            os_ << indent5 << "idx_y = aminfo_n3->idx[1][0];\n";
            os_ << indent5 << "idx_z = aminfo_n3->idx[2][0];\n";
            full_idx_x = StringBuilder("n1*", ncart2*ncart3m*ncart4, "+n2*", ncart3m*ncart4, "+idx_x*", ncart4, "+n4");
            full_idx_y = StringBuilder("n1*", ncart2*ncart3m*ncart4, "+n2*", ncart3m*ncart4, "+idx_y*", ncart4, "+n4");
            full_idx_z = StringBuilder("n1*", ncart2*ncart3m*ncart4, "+n2*", ncart3m*ncart4, "+idx_z*", ncart4, "+n4");
            os_ << indent5 << "if(idx_x >= 0) " << outvar << "[startidx + 6] -= aminfo_n3->ijk[0] * " << invar_3m << "[" << full_idx_x << "];\n";
            os_ << indent5 << "if(idx_y >= 0) " << outvar << "[startidx + 7] -= aminfo_n3->ijk[1] * " << invar_3m << "[" << full_idx_y << "];\n";
            os_ << indent5 << "if(idx_z >= 0) " << outvar << "[startidx + 8] -= aminfo_n3->ijk[2] * " << invar_3m << "[" << full_idx_z << "];\n";
        }
    }


    if(missing_center != 3)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Fourth Center\n";
        os_ << indent5 << "struct RecurInfo const * aminfo_n4 = aminfo_4 + n4;\n";
        os_ << indent5 << "idx_x = aminfo_n4->idx[0][2];\n";
        os_ << indent5 << "idx_y = aminfo_n4->idx[1][2];\n";
        os_ << indent5 << "idx_z = aminfo_n4->idx[2][2];\n";
        full_idx_x = StringBuilder("n1*", ncart2*ncart3*ncart4p, "+n2*", ncart3*ncart4p, "+n3*", ncart4p, "+idx_x");
        full_idx_y = StringBuilder("n1*", ncart2*ncart3*ncart4p, "+n2*", ncart3*ncart4p, "+n3*", ncart4p, "+idx_y");
        full_idx_z = StringBuilder("n1*", ncart2*ncart3*ncart4p, "+n2*", ncart3*ncart4p, "+n3*", ncart4p, "+idx_z");
        os_ << indent5 << outvar << "[startidx +  9] = " << invar_4p << "[" << full_idx_x << "];\n";
        os_ << indent5 << outvar << "[startidx + 10] = " << invar_4p << "[" << full_idx_y << "];\n";
        os_ << indent5 << outvar << "[startidx + 11] = " << invar_4p << "[" << full_idx_z << "];\n";

        if(am[3] > 0)
        {
            os_ << indent5 << "idx_x = aminfo_n4->idx[0][0];\n";
            os_ << indent5 << "idx_y = aminfo_n4->idx[1][0];\n";
            os_ << indent5 << "idx_z = aminfo_n4->idx[2][0];\n";
            full_idx_x = StringBuilder("n1*", ncart2*ncart3*ncart4m, "+n2*", ncart3*ncart4m, "+n3*", ncart4m, "+idx_x");
            full_idx_y = StringBuilder("n1*", ncart2*ncart3*ncart4m, "+n2*", ncart3*ncart4m, "+n3*", ncart4m, "+idx_y");
            full_idx_z = StringBuilder("n1*", ncart2*ncart3*ncart4m, "+n2*", ncart3*ncart4m, "+n3*", ncart4m, "+idx_z");
            os_ << indent5 << "if(idx_x >= 0) " << outvar << "[startidx +  9] -= aminfo_n4->ijk[0] * " << invar_4m << "[" << full_idx_x << "];\n";
            os_ << indent5 << "if(idx_y >= 0) " << outvar << "[startidx + 10] -= aminfo_n4->ijk[1] * " << invar_4m << "[" << full_idx_y << "];\n";
            os_ << indent5 << "if(idx_z >= 0) " << outvar << "[startidx + 11] -= aminfo_n4->ijk[2] * " << invar_4m << "[" << full_idx_z << "];\n";
        }
    }

    if(missing_center == 0)
    {
        os_ << "\n\n";
        os_ << indent5 << "// First Center\n";
        os_ << indent5 << outvar << "[startidx + 0] = -(" << outvar << "[startidx + 3] + " << outvar << "[startidx + 6] + " << outvar << "[startidx +  9]);\n";
        os_ << indent5 << outvar << "[startidx + 1] = -(" << outvar << "[startidx + 4] + " << outvar << "[startidx + 7] + " << outvar << "[startidx + 10]);\n";
        os_ << indent5 << outvar << "[startidx + 2] = -(" << outvar << "[startidx + 5] + " << outvar << "[startidx + 8] + " << outvar << "[startidx + 11]);\n";
    }

    if(missing_center == 1)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Second Center\n";
        os_ << indent5 << outvar << "[startidx + 3] = -(" << outvar << "[startidx + 0] + " << outvar << "[startidx + 6] + " << outvar << "[startidx +  9]);\n";
        os_ << indent5 << outvar << "[startidx + 4] = -(" << outvar << "[startidx + 1] + " << outvar << "[startidx + 7] + " << outvar << "[startidx + 10]);\n";
        os_ << indent5 << outvar << "[startidx + 5] = -(" << outvar << "[startidx + 2] + " << outvar << "[startidx + 8] + " << outvar << "[startidx + 11]);\n";
    }

    if(missing_center == 2)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Third Center\n";
        os_ << indent5 << outvar << "[startidx + 6] = -(" << outvar << "[startidx + 0] + " << outvar << "[startidx + 3] + " << outvar << "[startidx +  9]);\n";
        os_ << indent5 << outvar << "[startidx + 7] = -(" << outvar << "[startidx + 1] + " << outvar << "[startidx + 4] + " << outvar << "[startidx + 10]);\n";
        os_ << indent5 << outvar << "[startidx + 8] = -(" << outvar << "[startidx + 2] + " << outvar << "[startidx + 5] + " << outvar << "[startidx + 11]);\n";
    }

    if(missing_center == 3)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Fourth Center\n";
        os_ << indent5 << outvar << "[startidx +  9] = -(" << outvar << "[startidx + 0] + " << outvar << "[startidx + 3] + " << outvar << "[startidx + 6]);\n";
        os_ << indent5 << outvar << "[startidx + 10] = -(" << outvar << "[startidx + 1] + " << outvar << "[startidx + 4] + " << outvar << "[startidx + 7]);\n";
        os_ << indent5 << outvar << "[startidx + 11] = -(" << outvar << "[startidx + 2] + " << outvar << "[startidx + 5] + " << outvar << "[startidx + 8]);\n";
    }

    os_ << "\n\n";
    os_ << indent5 << "startidx += 12;\n";
    os_ << indent4 << "} // close loop for forming derivatives\n\n";

}